

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visit.hpp
# Opt level: O3

void mserialize::detail::visit_tuple<binlog::ToStringVisitor,binlog::Range>
               (string_view full_tag,string_view tag,ToStringVisitor *visitor,Range *istream,
               int max_recursion)

{
  detail *pdVar1;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  size_t extraout_RDX;
  detail *this;
  char *pcVar7;
  detail *this_00;
  string_view tag_00;
  TupleBegin TVar8;
  string_view tags;
  string_view tags_00;
  size_t extraout_RDX_00;
  
  uVar3 = (ulong)(tag._len != 0);
  this_00 = (detail *)(tag._ptr + uVar3);
  lVar5 = tag._len - uVar3;
  pcVar7 = (char *)0x0;
  if (lVar5 != 0) {
    pcVar7 = (char *)(lVar5 - 1);
  }
  TVar8.tag._len = (size_t)pcVar7;
  TVar8.tag._ptr = (char *)this_00;
  bVar2 = binlog::ToStringVisitor::visit(visitor,TVar8,istream);
  if (bVar2) {
    return;
  }
  tags._len = extraout_RDX;
  tags._ptr = pcVar7;
  pcVar4 = (char *)tag_first_size(this_00,tags);
  if (pcVar4 != (char *)0x0) {
    pcVar6 = pcVar4;
    if (pcVar7 < pcVar4) {
      pcVar6 = pcVar7;
    }
    pcVar7 = pcVar7 + -(long)pcVar6;
    pdVar1 = (detail *)(pcVar6 + (long)this_00);
    do {
      this = pdVar1;
      tag_00._len = (size_t)pcVar4;
      tag_00._ptr = (char *)this_00;
      visit_impl<binlog::ToStringVisitor,binlog::Range>
                (full_tag,tag_00,visitor,istream,max_recursion);
      tags_00._len = extraout_RDX_00;
      tags_00._ptr = pcVar7;
      pcVar4 = (char *)tag_first_size(this,tags_00);
      pcVar6 = pcVar4;
      if (pcVar7 < pcVar4) {
        pcVar6 = pcVar7;
      }
      pcVar7 = pcVar7 + -(long)pcVar6;
      pdVar1 = this + (long)pcVar6;
      this_00 = this;
    } while (pcVar4 != (char *)0x0);
  }
  binlog::ToStringVisitor::visit(visitor);
  return;
}

Assistant:

void visit_tuple(const string_view full_tag, string_view tag, Visitor& visitor, InputStream& istream, int max_recursion)
{
  tag.remove_prefix(1); // drop (
  tag.remove_suffix(1); // drop )

  const bool skip = visitor.visit(mserialize::Visitor::TupleBegin{tag}, istream);
  if (skip) { return; }

  for (string_view elem_tag = tag_pop(tag); ! elem_tag.empty(); elem_tag = tag_pop(tag))
  {
    visit_impl(full_tag, elem_tag, visitor, istream, max_recursion);
  }

  visitor.visit(mserialize::Visitor::TupleEnd{});
}